

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O0

string * __thiscall
SL::WS_LITE::Base64decode<std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,WS_LITE *this,
          basic_string_view<char,_std::char_traits<char>_> *base64)

{
  int len;
  BIO_METHOD *type;
  BIO *b;
  const_reference buf;
  size_type sVar1;
  BIO *pBVar2;
  void *data;
  int decoded_length;
  BIO *bio;
  BIO *b64;
  basic_string_view<char,_std::char_traits<char>_> *base64_local;
  string *ascii;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)this);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  type = BIO_f_base64();
  b = BIO_new(type);
  BIO_set_flags(b,0x100);
  buf = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                  ((basic_string_view<char,_std::char_traits<char>_> *)this,0);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  pBVar2 = BIO_new_mem_buf(buf,(int)sVar1);
  pBVar2 = BIO_push(b,pBVar2);
  data = (void *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  len = std::__cxx11::string::size();
  BIO_read(pBVar2,data,len);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  BIO_free_all(b);
  return __return_storage_ptr__;
}

Assistant:

std::string Base64decode(const type &base64)
    {
        // Resize ascii, however, the size is a up to two bytes too large.
        std::string ascii;
        ascii.resize((6 * base64.size()) / 8);
        BIO *b64, *bio;

        b64 = BIO_new(BIO_f_base64());
        BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);
        bio = BIO_new_mem_buf((char *)&base64[0], static_cast<int>(base64.size()));
        bio = BIO_push(b64, bio);

        int decoded_length = BIO_read(bio, &ascii[0], static_cast<int>(ascii.size()));
        ascii.resize(decoded_length);

        BIO_free_all(b64);
        return ascii;
    }